

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

void __thiscall capnp::anon_unknown_79::Input::consume(Input *this,char expected)

{
  bool bVar1;
  Fault local_50;
  Fault f;
  undefined1 local_40 [8];
  DebugComparison<char_&,_char_&> _kjCondition;
  char current;
  char expected_local;
  Input *this_local;
  
  _kjCondition._39_1_ = expected;
  _kjCondition._38_1_ = nextChar(this);
  f.exception = (Exception *)
                kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition.field_0x26);
  kj::_::DebugExpression<char&>::operator==
            ((DebugComparison<char_&,_char_&> *)local_40,(DebugExpression<char&> *)&f,
             &_kjCondition.field_0x27);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_40);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<char&,char&>&,char_const(&)[34]>
              (&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
               ,0x244,FAILED,"current == expected",
               "_kjCondition,\"Unexpected input in JSON message.\"",
               (DebugComparison<char_&,_char_&> *)local_40,
               (char (*) [34])"Unexpected input in JSON message.");
    kj::_::Debug::Fault::fatal(&local_50);
  }
  advance(this,1);
  return;
}

Assistant:

void consume(char expected) {
    char current = nextChar();
    KJ_REQUIRE(current == expected, "Unexpected input in JSON message.");

    advance();
  }